

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

Symbols * Preprocessor::macroExpandIdentifier
                    (Symbols *__return_storage_ptr__,Preprocessor *that,SymbolStack *symbols,
                    int lineNum,QByteArray *macroName)

{
  SafeSymbols *pSVar1;
  Data<QHashPrivate::Node<SubArray,_Macro>_> *this;
  QArrayData *pQVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  Token TVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  SafeSymbols *pSVar13;
  long lVar14;
  QList<Symbol> *pQVar15;
  ulong uVar16;
  Symbol *pSVar17;
  long lVar18;
  qsizetype i;
  char *pcVar19;
  value_type *this_00;
  char cVar20;
  Symbol *pSVar21;
  Symbol *pSVar22;
  QArrayDataPointer<Symbol> *this_01;
  long in_FS_OFFSET;
  bool bVar23;
  bool bVar24;
  Bucket BVar25;
  QByteArrayView before;
  QByteArrayView after;
  QByteArrayView data;
  qsizetype idx;
  long local_278;
  QByteArray local_248;
  QByteArray local_228;
  Symbol local_208;
  QByteArray local_1d8;
  undefined1 local_1b8 [56];
  Symbol *pSStack_180;
  long local_178;
  Macro local_170;
  Symbol local_138;
  value_type local_108;
  Symbol local_c8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  long local_50;
  long local_48;
  QArrayDataPointer<Symbol> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
  lVar14 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
  pSVar21 = pSVar1[lVar14 + -1].symbols.d.ptr;
  lVar14 = pSVar1[lVar14 + -1].index;
  local_138.lineNum = pSVar21[lVar14 + -1].lineNum;
  local_138.token = pSVar21[lVar14 + -1].token;
  local_138.lex.d.d = pSVar21[lVar14 + -1].lex.d.d;
  local_138.lex.d.ptr = pSVar21[lVar14 + -1].lex.d.ptr;
  local_138.lex.d.size = pSVar21[lVar14 + -1].lex.d.size;
  if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138.from = pSVar21[lVar14 + -1].from;
  local_138.len = pSVar21[lVar14 + -1].len;
  if (local_138.token == IDENTIFIER) {
    if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_138.lex.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this = (that->macros).d;
    bVar23 = true;
    local_c8._0_8_ = local_138.lex.d.d;
    local_c8.lex.d.d = (Data *)local_138.lex.d.ptr;
    local_c8.lex.d.ptr = (char *)local_138.lex.d.size;
    local_c8.lex.d.size = local_138.from;
    local_c8.from = local_138.len;
    if (this != (Data<QHashPrivate::Node<SubArray,_Macro>_> *)0x0) {
      BVar25 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
                         (this,(SubArray *)&local_c8);
      if (((BVar25.span)->offsets[BVar25.index] != 0xff) && ((BVar25.span)->entries != (Entry *)0x0)
         ) {
        QByteArray::mid((QByteArray *)&local_108,&local_138.lex,local_138.from,local_138.len);
        pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
        pSVar13 = pSVar1 + (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
        cVar7 = std::
                __find_if<QList<SafeSymbols>::const_iterator,__gnu_cxx::__ops::_Iter_pred<SymbolStack::dontReplaceSymbol(QByteArray_const&)const::_lambda(SafeSymbols_const&)_1_>>
                          (pSVar1,pSVar13,&local_108);
        bVar23 = cVar7.i != pSVar13;
        if ((Symbol *)local_108.symbols.d.d != (Symbol *)0x0) {
          LOCK();
          ((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_108.symbols.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8._0_8_,1,0x10);
      }
    }
    if (!bVar23) {
      local_c8._0_8_ = local_138.lex.d.d;
      local_c8.lex.d.d = (Data *)local_138.lex.d.ptr;
      local_c8.lex.d.ptr = (char *)local_138.lex.d.size;
      if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
        ;
        UNLOCK();
      }
      local_c8.lex.d.size = local_138.from;
      local_c8.from = local_138.len;
      QHash<SubArray,_Macro>::value(&local_170,&that->macros,(SubArray *)&local_c8);
      if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,1,0x10);
        }
      }
      QByteArray::mid((QByteArray *)&local_c8,&local_138.lex,local_138.from,local_138.len);
      pQVar2 = &((macroName->d).d)->super_QArrayData;
      pSVar21 = (Symbol *)(macroName->d).ptr;
      (macroName->d).d = (Data *)local_c8._0_8_;
      (macroName->d).ptr = (char *)local_c8.lex.d.d;
      pcVar19 = (char *)(macroName->d).size;
      (macroName->d).size = (qsizetype)local_c8.lex.d.ptr;
      local_c8._0_8_ = pQVar2;
      local_c8.lex.d.d = (Data *)pSVar21;
      local_c8.lex.d.ptr = pcVar19;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,1,0x10);
        }
      }
      local_1b8._48_8_ = (Data *)0x0;
      pSStack_180 = (Symbol *)0x0;
      local_178 = 0;
      if (local_170.isFunction == true) {
        bVar23 = false;
        while( true ) {
          pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
          lVar14 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
          lVar10 = lVar14 << 6;
          do {
            lVar18 = lVar10;
            if (lVar18 + -0x40 == -0x40) goto LAB_0013cf5b;
            lVar3 = *(long *)((long)pSVar1 + lVar18 + -8);
            lVar10 = lVar18 + -0x40;
          } while (*(long *)((long)pSVar1 + lVar18 + -0x30) <= lVar3);
          if (*(int *)(*(long *)((long)&pSVar1[-1].symbols.d.ptr + lVar18) + 4 + lVar3 * 0x30) !=
              0xa5) break;
          SymbolStack::next(symbols);
          bVar23 = true;
        }
LAB_0013cf5b:
        lVar14 = lVar14 << 6;
        do {
          lVar10 = lVar14;
          if (lVar10 + -0x40 == -0x40) goto LAB_0013d353;
          lVar18 = *(long *)((long)pSVar1 + lVar10 + -8);
          lVar14 = lVar10 + -0x40;
        } while (*(long *)((long)pSVar1 + lVar10 + -0x30) <= lVar18);
        if (*(int *)(*(long *)((long)&pSVar1[-1].symbols.d.ptr + lVar10) + 4 + lVar18 * 0x30) == 9)
        {
          SymbolStack::next(symbols);
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = 0xaaaaaaaa;
          uStack_64 = 0xaaaaaaaa;
          uStack_60 = 0xaaaaaaaa;
          uStack_5c = 0xaaaaaaaa;
          local_78 = 0xaaaaaaaa;
          uStack_74 = 0xaaaaaaaa;
          uStack_70 = 0xaaaaaaaa;
          uStack_6c = 0xaaaaaaaa;
          local_88 = 0xaaaaaaaa;
          uStack_84 = 0xaaaaaaaa;
          uStack_80 = 0xaaaaaaaa;
          uStack_7c = 0xaaaaaaaa;
          local_98 = 0xaaaaaaaa;
          uStack_94 = 0xaaaaaaaa;
          uStack_90 = 0xaaaaaaaa;
          uStack_8c = 0xaaaaaaaa;
          local_c8.from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_c8.len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_c8.lex.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          local_c8.lex.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c8.lex.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_50 = 5;
          local_48 = 0;
          local_40 = (QArrayDataPointer<Symbol> *)&local_c8;
          if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
            do {
              iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
              lVar14 = iVar8.i[-1].index;
              iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
              if (lVar14 < iVar8.i[-1].symbols.d.size) {
                lVar14 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
                if (lVar14 != 0) {
                  local_1b8._0_8_ = (Symbol *)0x0;
                  local_1b8._8_8_ = (Symbol *)0x0;
                  local_1b8._16_8_ = (Symbol *)0x0;
                  while( true ) {
                    pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
                    lVar10 = lVar14 << 6;
                    do {
                      lVar18 = lVar10;
                      if (lVar18 + -0x40 == -0x40) goto LAB_0013d0ed;
                      lVar3 = *(long *)((long)pSVar1 + lVar18 + -8);
                      lVar10 = lVar18 + -0x40;
                    } while (*(long *)((long)pSVar1 + lVar18 + -0x30) <= lVar3);
                    if (*(int *)(*(long *)((long)&pSVar1[-1].symbols.d.ptr + lVar18) + 4 +
                                lVar3 * 0x30) != 0xa5) break;
                    SymbolStack::next(symbols);
                    lVar14 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
                  }
LAB_0013d0ed:
                  bVar23 = local_170.isVariadic != true;
                  bVar24 = local_48 != local_170.arguments.d.size + -1;
                  iVar12 = 0;
                  if (lVar14 != 0) {
                    iVar11 = 0;
                    do {
                      iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
                      lVar14 = iVar8.i[-1].index;
                      iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
                      iVar12 = iVar11;
                      if (lVar14 < iVar8.i[-1].symbols.d.size) {
                        if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size ==
                            0) break;
                        TVar6 = SymbolStack::next(symbols);
                        if (TVar6 == PP_RPAREN) {
                          iVar12 = iVar11 + -1;
                          if (iVar11 < 1) break;
                        }
                        else if (TVar6 == LPAREN) {
                          iVar12 = iVar11 + 1;
                        }
                        else if ((TVar6 == COMMA && iVar11 == 0) && (bVar23 || bVar24)) {
                          iVar12 = 0;
                          break;
                        }
                        pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr
                        ;
                        lVar14 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.
                                 size;
                        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                                  ((QMovableArrayOps<Symbol> *)local_1b8,local_1b8._16_8_,
                                   pSVar1[lVar14 + -1].symbols.d.ptr +
                                   pSVar1[lVar14 + -1].index + -1);
                        QList<Symbol>::end((QList<Symbol> *)local_1b8);
                      }
                      else {
                        QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
                        QHash<QByteArray,_QHashDummyValue>::~QHash
                                  (&local_108.excludedSymbols.q_hash);
                        if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
                          LOCK();
                          ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i =
                               ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate
                                      (&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
                          }
                        }
                        QArrayDataPointer<Symbol>::~QArrayDataPointer
                                  ((QArrayDataPointer<Symbol> *)&local_108);
                      }
                      iVar11 = iVar12;
                    } while ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size !=
                             0);
                  }
                  if (local_48 == local_50) {
                    local_108.symbols.d.d = (Data *)local_1b8._0_8_;
                    local_108.symbols.d.ptr = (Symbol *)local_1b8._8_8_;
                    local_108.symbols.d.size = local_1b8._16_8_;
                    if ((Symbol *)local_1b8._0_8_ != (Symbol *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>>
                              ((QVLABase<QList<Symbol>> *)&local_50,5,&local_c8,&local_108.symbols);
                    QArrayDataPointer<Symbol>::~QArrayDataPointer
                              ((QArrayDataPointer<Symbol> *)&local_108);
                  }
                  else {
                    QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>const&>
                              ((QVLABase<QList<Symbol>> *)&local_50,5,&local_c8,
                               (QList<Symbol> *)local_1b8);
                  }
                  if (-1 < iVar12) {
                    if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0) {
                      while( true ) {
                        iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
                        lVar14 = iVar8.i[-1].index;
                        iVar8 = QList<SafeSymbols>::end((QList<SafeSymbols> *)symbols);
                        if (lVar14 < iVar8.i[-1].symbols.d.size) break;
                        QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
                        QHash<QByteArray,_QHashDummyValue>::~QHash
                                  (&local_108.excludedSymbols.q_hash);
                        if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
                          LOCK();
                          ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i =
                               ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate
                                      (&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
                          }
                        }
                        QArrayDataPointer<Symbol>::~QArrayDataPointer
                                  ((QArrayDataPointer<Symbol> *)&local_108);
                        if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size ==
                            0) goto LAB_0013de58;
                      }
                      if ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0)
                      {
                        this_00 = (value_type *)local_1b8;
                        goto LAB_0013d336;
                      }
                    }
LAB_0013de58:
                    pcVar19 = "missing \')\' in macro usage";
                    goto LAB_0013de5f;
                  }
                  QArrayDataPointer<Symbol>::~QArrayDataPointer
                            ((QArrayDataPointer<Symbol> *)local_1b8);
                }
                break;
              }
              QList<SafeSymbols>::takeLast(&local_108,(QList<SafeSymbols> *)symbols);
              QHash<QByteArray,_QHashDummyValue>::~QHash(&local_108.excludedSymbols.q_hash);
              this_00 = &local_108;
              if ((Symbol *)local_108.expandedMacro.d.d != (Symbol *)0x0) {
                LOCK();
                ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_108.expandedMacro.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_108.expandedMacro.d.d)->super_QArrayData,1,0x10);
                }
              }
LAB_0013d336:
              QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)this_00);
            } while ((symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size != 0);
          }
          if ((local_170.isVariadic == true) && (local_48 == local_170.arguments.d.size + -1)) {
            local_108.symbols.d.d = (Data *)0x0;
            local_108.symbols.d.ptr = (Symbol *)0x0;
            local_108.symbols.d.size = 0;
            QVLABase<QList<Symbol>>::emplace_back_impl<QList<Symbol>>
                      ((QVLABase<QList<Symbol>> *)&local_50,5,&local_c8,&local_108.symbols);
            QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_108);
          }
          if (local_170.symbols.d.size != 0) {
            pSVar17 = local_170.symbols.d.ptr + local_170.symbols.d.size;
            cVar20 = '\0';
            pSVar21 = local_170.symbols.d.ptr;
            do {
              while ((TVar6 = pSVar21->token, TVar6 != PP_HASHHASH && (TVar6 != HASH))) {
                local_278 = -1;
                if (local_170.arguments.d.size != 0) {
                  lVar14 = local_170.arguments.d.size * 0x30;
                  lVar10 = 0x30 - (long)local_170.arguments.d.ptr;
                  pSVar22 = local_170.arguments.d.ptr;
                  do {
                    lVar18 = lVar10;
                    if (lVar14 == 0) goto LAB_0013d5fb;
                    bVar23 = Symbol::operator==(pSVar22,pSVar21);
                    pSVar22 = pSVar22 + 1;
                    lVar14 = lVar14 + -0x30;
                    lVar10 = lVar18 + -0x30;
                  } while (!bVar23);
                  local_278 = (-((long)&local_170.arguments.d.ptr[-1].lineNum + lVar18) >> 4) *
                              -0x5555555555555555;
                }
LAB_0013d5fb:
                pQVar15 = (QList<Symbol> *)(local_1b8 + 0x30);
                if (cVar20 == '\x01') {
                  if (local_278 < 0) {
                    pcVar19 = "\'#\' is not followed by a macro parameter";
                  }
                  else {
                    if (local_278 < local_48) {
                      local_1b8._0_8_ = (Symbol *)0x0;
                      local_1b8._8_8_ = (Symbol *)0x0;
                      local_1b8._16_8_ = (Symbol *)0x0;
                      lVar14 = *(long *)((long)(local_40 + local_278) + 0x10);
                      if (lVar14 != 0) {
                        lVar10 = *(long *)((long)(local_40 + local_278) + 8);
                        lVar18 = 0;
                        do {
                          QByteArray::mid((QByteArray *)&local_108,
                                          (QByteArray *)(lVar10 + 8 + lVar18),
                                          *(qsizetype *)(lVar10 + 0x20 + lVar18),
                                          *(qsizetype *)(lVar10 + 0x28 + lVar18));
                          QByteArray::append((QByteArray *)local_1b8,(QByteArray *)&local_108);
                          if ((Symbol *)local_108.symbols.d.d != (Symbol *)0x0) {
                            LOCK();
                            ((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_108.symbols.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate
                                        (&(local_108.symbols.d.d)->super_QArrayData,1,0x10);
                            }
                          }
                          lVar18 = lVar18 + 0x30;
                        } while (lVar14 * 0x30 != lVar18);
                      }
                      local_108.symbols.d.d._0_1_ = 0x22;
                      before.m_data = (storage_type *)&local_108;
                      before.m_size = 1;
                      after.m_data = "\\\"";
                      after.m_size = 2;
                      QByteArray::replace((QByteArray *)local_1b8,before,after);
                      local_108.symbols.d.d = (Data *)CONCAT71(local_108.symbols.d.d._1_7_,0x22);
                      data.m_data = (storage_type *)&local_108;
                      data.m_size = 1;
                      QByteArray::insert((QByteArray *)local_1b8,0,data);
                      QByteArray::append((QByteArray *)local_1b8,'\"');
                      local_108.symbols.d.d = (Data *)CONCAT44(4,lineNum);
                      local_108.symbols.d.ptr = (Symbol *)local_1b8._0_8_;
                      local_108.symbols.d.size = local_1b8._8_8_;
                      local_108.expandedMacro.d.d = (Data *)local_1b8._16_8_;
                      if ((Symbol *)local_1b8._0_8_ != (Symbol *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                      local_108.expandedMacro.d.ptr = (char *)0x0;
                      local_108.expandedMacro.d.size = local_1b8._16_8_;
                      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                                ((QMovableArrayOps<Symbol> *)(local_1b8 + 0x30),local_178,
                                 (Symbol *)&local_108);
                      QList<Symbol>::end((QList<Symbol> *)(local_1b8 + 0x30));
                      if (local_108.symbols.d.ptr != (Symbol *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                        super___atomic_base<int>._M_i =
                             (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_108.symbols.d.ptr,1,0x10);
                        }
                      }
                      if ((Symbol *)local_1b8._0_8_ == (Symbol *)0x0) goto LAB_0013dd0a;
                      LOCK();
                      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      iVar12 = (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i;
                      UNLOCK();
                      pSVar22 = (Symbol *)local_1b8._0_8_;
joined_r0x0013d867:
                      if (iVar12 == 0) {
                        QArrayData::deallocate((QArrayData *)pSVar22,1,0x10);
                      }
LAB_0013dd0a:
                      cVar20 = '\0';
                      goto LAB_0013dd0d;
                    }
                    pcVar19 = "Macro invoked with too few parameters for a use of \'#\'";
                  }
                  goto LAB_0013de5f;
                }
                if (cVar20 == '\0') {
                  if ((local_278 < 0) || (local_48 <= local_278)) {
                    QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                              ((QMovableArrayOps<Symbol> *)pQVar15,local_178,pSVar21);
                    QList<Symbol>::end(pQVar15);
                  }
                  else {
                    if ((pSVar21 == pSVar17 + -(ulong)(local_170.symbols.d.size != 0)) ||
                       (pSVar21[1].token != PP_HASHHASH)) {
                      local_108.symbols.d.d = local_40[local_278].d;
                      local_108.symbols.d.ptr = *(Symbol **)((long)(local_40 + local_278) + 8);
                      local_108.symbols.d.size = *(qsizetype *)((long)(local_40 + local_278) + 0x10)
                      ;
                      if ((Symbol *)local_108.symbols.d.d != (Symbol *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)&((Symbol *)local_108.symbols.d.d)->lineNum)->_q_value)
                        .super___atomic_base<int>._M_i =
                             (((QBasicAtomicInt *)&((Symbol *)local_108.symbols.d.d)->lineNum)->
                             _q_value).super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                      local_1b8._0_8_ = (Symbol *)0x1;
                      SymbolStack::excludeSymbols((SymbolStack *)&local_208);
                      cVar20 = '\0';
                      macroExpand(pQVar15,that,&local_108.symbols,(qsizetype *)local_1b8,lineNum,
                                  false,(QSet<QByteArray> *)&local_208);
                      QHash<QByteArray,_QHashDummyValue>::~QHash
                                ((QHash<QByteArray,_QHashDummyValue> *)&local_208);
                      QArrayDataPointer<Symbol>::~QArrayDataPointer
                                ((QArrayDataPointer<Symbol> *)&local_108);
                      goto LAB_0013dd0d;
                    }
                    QtPrivate::QCommonArrayOps<Symbol>::growAppend
                              ((QCommonArrayOps<Symbol> *)pQVar15,
                               *(Symbol **)((long)(local_40 + local_278) + 8),
                               *(Symbol **)((long)(local_40 + local_278) + 8) +
                               *(long *)((long)(local_40 + local_278) + 0x10));
                  }
                  goto LAB_0013dd0a;
                }
                if (pSVar21->token != PP_WHITESPACE) {
                  while ((local_178 != 0 && (pSStack_180[local_178 + -1].token == PP_WHITESPACE))) {
                    QList<Symbol>::pop_back(pQVar15);
                  }
                  local_108.symbols.d.d = *(Data **)pSVar21;
                  local_108.symbols.d.ptr = (Symbol *)(pSVar21->lex).d.d;
                  local_108.symbols.d.size = (qsizetype)(pSVar21->lex).d.ptr;
                  local_108.expandedMacro.d.d = (Data *)(pSVar21->lex).d.size;
                  if (local_108.symbols.d.ptr != (Symbol *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                    super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                         super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  local_108.expandedMacro.d.ptr = (char *)pSVar21->from;
                  local_108.expandedMacro.d.size = pSVar21->len;
                  if ((local_278 < 0) || (local_48 <= local_278)) {
LAB_0013d9af:
                    pQVar15 = (QList<Symbol> *)(local_1b8 + 0x30);
                    if (((local_178 == 0) ||
                        (pSStack_180[local_178 + -1].token == PP_STRING_LITERAL)) ||
                       (pSStack_180[local_178 + -1].token != pSVar21->token)) {
                      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                                ((QMovableArrayOps<Symbol> *)pQVar15,local_178,(Symbol *)&local_108)
                      ;
                      QList<Symbol>::end(pQVar15);
                    }
                    else {
                      local_1b8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_1b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      iVar9 = QList<Symbol>::end(pQVar15);
                      local_1b8._0_8_ = *(undefined8 *)(iVar9.i + -1);
                      local_1b8._8_8_ = iVar9.i[-1].lex.d.d;
                      local_1b8._16_8_ = iVar9.i[-1].lex.d.ptr;
                      iVar9.i[-1].lex.d.d = (Data *)0x0;
                      iVar9.i[-1].lex.d.ptr = (char *)0x0;
                      local_1b8._24_8_ = iVar9.i[-1].lex.d.size;
                      iVar9.i[-1].lex.d.size = 0;
                      local_1b8._32_8_ = iVar9.i[-1].from;
                      local_1b8._40_8_ = iVar9.i[-1].len;
                      QtPrivate::QGenericArrayOps<Symbol>::eraseLast
                                ((QGenericArrayOps<Symbol> *)pQVar15);
                      local_1d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      local_1d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                      local_1d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
                      QByteArray::mid(&local_228,(QByteArray *)(local_1b8 + 8),local_1b8._32_8_,
                                      local_1b8._40_8_);
                      QByteArray::mid(&local_248,(QByteArray *)&local_108.symbols.d.ptr,
                                      (qsizetype)local_108.expandedMacro.d.ptr,
                                      local_108.expandedMacro.d.size);
                      local_208.lex.d.ptr = (char *)local_228.d.size;
                      local_208.lex.d.d = (Data *)local_228.d.ptr;
                      local_208._0_8_ = local_228.d.d;
                      local_208.len = local_248.d.size;
                      local_208.from = (qsizetype)local_248.d.ptr;
                      local_208.lex.d.size = (qsizetype)local_248.d.d;
                      local_228.d.d = (Data *)0x0;
                      local_228.d.ptr = (char *)0x0;
                      local_228.d.size = 0;
                      local_248.d.d = (Data *)0x0;
                      local_248.d.ptr = (char *)0x0;
                      local_248.d.size = 0;
                      QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>
                                (&local_1d8,(QStringBuilder<QByteArray,_QByteArray> *)&local_208);
                      QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
                                ((QStringBuilder<QByteArray,_QByteArray> *)&local_208);
                      if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_248.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_248.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      if ((Data *)local_228.d.d != (Data *)0x0) {
                        LOCK();
                        ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_228.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_228.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      local_208.token = local_1b8._4_4_;
                      local_208.lineNum = lineNum;
                      local_208.lex.d.d = local_1d8.d.d;
                      local_208.lex.d.ptr = local_1d8.d.ptr;
                      local_208.lex.d.size = local_1d8.d.size;
                      if ((SafeSymbols *)local_1d8.d.d != (SafeSymbols *)0x0) {
                        LOCK();
                        ((__atomic_base<int> *)
                        &(((Symbols *)&(local_1d8.d.d)->super_QArrayData)->d).d)->_M_i =
                             ((__atomic_base<int> *)
                             &(((Symbols *)&(local_1d8.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                        UNLOCK();
                      }
                      local_208.from = 0;
                      local_208.len = local_1d8.d.size;
                      QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                                ((QMovableArrayOps<Symbol> *)(local_1b8 + 0x30),local_178,&local_208
                                );
                      QList<Symbol>::end((QList<Symbol> *)(local_1b8 + 0x30));
                      if ((SafeSymbols *)local_208.lex.d.d != (SafeSymbols *)0x0) {
                        LOCK();
                        ((__atomic_base<int> *)
                        &(((Symbols *)&(local_208.lex.d.d)->super_QArrayData)->d).d)->_M_i =
                             ((__atomic_base<int> *)
                             &(((Symbols *)&(local_208.lex.d.d)->super_QArrayData)->d).d)->_M_i + -1
                        ;
                        UNLOCK();
                        if (((__atomic_base<int> *)
                            &(((Symbols *)&(local_208.lex.d.d)->super_QArrayData)->d).d)->_M_i == 0)
                        {
                          QArrayData::deallocate(&(local_208.lex.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      if ((SafeSymbols *)local_1d8.d.d != (SafeSymbols *)0x0) {
                        LOCK();
                        ((__atomic_base<int> *)
                        &(((Symbols *)&(local_1d8.d.d)->super_QArrayData)->d).d)->_M_i =
                             ((__atomic_base<int> *)
                             &(((Symbols *)&(local_1d8.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                        UNLOCK();
                        if (((__atomic_base<int> *)
                            &(((Symbols *)&(local_1d8.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                          QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      if ((Symbol *)local_1b8._8_8_ != (Symbol *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_1b8._8_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_1b8._8_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_1b8._8_8_)->_q_value).
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_1b8._8_8_,1,0x10);
                        }
                      }
                    }
                    if (((-1 < local_278) && (local_278 < local_48)) &&
                       (*(long *)((long)(local_40 + local_278) + 0x10) != 0)) {
                      QtPrivate::QCommonArrayOps<Symbol>::growAppend
                                ((QCommonArrayOps<Symbol> *)(local_1b8 + 0x30),
                                 (Symbol *)(*(long *)((long)(local_40 + local_278) + 8) + 0x30),
                                 (Symbol *)
                                 (*(long *)((long)(local_40 + local_278) + 8) +
                                 *(long *)((long)(local_40 + local_278) + 0x10) * 0x30));
                    }
                  }
                  else if (*(long *)((long)(local_40 + local_278) + 0x10) != 0) {
                    plVar4 = *(long **)((long)(local_40 + local_278) + 8);
                    local_108.symbols.d.d = (Data *)*plVar4;
                    QByteArray::operator=
                              ((QByteArray *)&local_108.symbols.d.ptr,(QByteArray *)(plVar4 + 1));
                    local_108.expandedMacro.d.ptr = (char *)plVar4[4];
                    local_108.expandedMacro.d.size = plVar4[5];
                    goto LAB_0013d9af;
                  }
                  if (local_108.symbols.d.ptr != (Symbol *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                    super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                         super___atomic_base<int>._M_i + -1;
                    iVar12 = (((QBasicAtomicInt *)&(local_108.symbols.d.ptr)->lineNum)->_q_value).
                             super___atomic_base<int>._M_i;
                    UNLOCK();
                    pSVar22 = local_108.symbols.d.ptr;
                    goto joined_r0x0013d867;
                  }
                  goto LAB_0013dd0a;
                }
                pSVar21 = pSVar21 + 1;
                cVar20 = '\x02';
                if (pSVar21 == pSVar17) goto LAB_0013de80;
              }
              cVar20 = (TVar6 != HASH) + '\x01';
LAB_0013dd0d:
              pSVar21 = pSVar21 + 1;
            } while (pSVar21 != pSVar17);
            if (cVar20 == '\0') goto LAB_0013ddf3;
LAB_0013de80:
            pcVar19 = "\'#\' or \'##\' found at the end of a macro argument";
LAB_0013de5f:
            Parser::error(&that->super_Parser,pcVar19);
          }
LAB_0013ddf3:
          if (0 < local_48) {
            uVar16 = local_48 + 1;
            this_01 = local_40;
            do {
              QArrayDataPointer<Symbol>::~QArrayDataPointer(this_01);
              this_01 = this_01 + 1;
              uVar16 = uVar16 - 1;
            } while (1 < uVar16);
          }
          if (local_40 != (QArrayDataPointer<Symbol> *)&local_c8) {
            QtPrivate::sizedFree(local_40,local_50 * 0x18);
          }
          goto LAB_0013cf27;
        }
LAB_0013d353:
        pQVar2 = &((macroName->d).d)->super_QArrayData;
        (macroName->d).d = (Data *)0x0;
        (macroName->d).ptr = (char *)0x0;
        (macroName->d).size = 0;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,1,0x10);
          }
        }
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (bVar23) {
          local_c8.token = 0xa5;
          local_c8.lineNum = lineNum;
          local_c8.lex.d.d = (Data *)0x0;
          local_c8.lex.d.ptr = (char *)0x0;
          local_c8.lex.d.size = 0;
          local_c8.from = 0;
          local_c8.len = -1;
          QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
                    ((QMovableArrayOps<Symbol> *)__return_storage_ptr__,0,&local_c8);
          QList<Symbol>::end(__return_storage_ptr__);
          if ((Symbol *)local_c8.lex.d.d != (Symbol *)0x0) {
            LOCK();
            ((local_c8.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_c8.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_c8.lex.d.d)->super_QArrayData,1,0x10);
            }
          }
          i = (__return_storage_ptr__->d).size;
        }
        else {
          i = 0;
        }
        QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol_const&>
                  ((QMovableArrayOps<Symbol> *)__return_storage_ptr__,i,&local_138);
        QList<Symbol>::end(__return_storage_ptr__);
        iVar9 = QList<Symbol>::end(__return_storage_ptr__);
        iVar9.i[-1].lineNum = lineNum;
      }
      else {
        QArrayDataPointer<Symbol>::operator=
                  ((QArrayDataPointer<Symbol> *)(local_1b8 + 0x30),&local_170.symbols.d);
LAB_0013cf27:
        lVar14 = local_178;
        pSVar21 = pSStack_180;
        uVar5 = local_1b8._48_8_;
        local_1b8._48_8_ = (Data *)0x0;
        pSStack_180 = (Symbol *)0x0;
        (__return_storage_ptr__->d).d = (Data *)uVar5;
        (__return_storage_ptr__->d).ptr = pSVar21;
        local_178 = 0;
        (__return_storage_ptr__->d).size = lVar14;
      }
      QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)(local_1b8 + 0x30))
      ;
      QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_170.symbols.d);
      QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_170.arguments.d);
      goto LAB_0013d444;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0013d444:
  if (&(local_138.lex.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.lex.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

Symbols Preprocessor::macroExpandIdentifier(Preprocessor *that, SymbolStack &symbols, int lineNum, QByteArray *macroName)
{
    Symbol s = symbols.symbol();

    // not a macro
    if (s.token != PP_IDENTIFIER || !that->macros.contains(s) || symbols.dontReplaceSymbol(s.lexem())) {
        return Symbols();
    }

    const Macro &macro = that->macros.value(s);
    *macroName = s.lexem();

    Symbols expansion;
    if (!macro.isFunction) {
        expansion = macro.symbols;
    } else {
        bool haveSpace = false;
        while (symbols.test(PP_WHITESPACE)) { haveSpace = true; }
        if (!symbols.test(PP_LPAREN)) {
            *macroName = QByteArray();
            Symbols syms;
            if (haveSpace)
                syms += Symbol(lineNum, PP_WHITESPACE);
            syms += s;
            syms.last().lineNum = lineNum;
            return syms;
        }
        QVarLengthArray<Symbols, 5> arguments;
        while (symbols.hasNext()) {
            Symbols argument;
            // strip leading space
            while (symbols.test(PP_WHITESPACE)) {}
            int nesting = 0;
            bool vararg = macro.isVariadic && (arguments.size() == macro.arguments.size() - 1);
            while (symbols.hasNext()) {
                Token t = symbols.next();
                if (t == PP_LPAREN) {
                    ++nesting;
                } else if (t == PP_RPAREN) {
                    --nesting;
                    if (nesting < 0)
                        break;
                } else if (t == PP_COMMA && nesting == 0) {
                    if (!vararg)
                        break;
                }
                argument += symbols.symbol();
            }
            arguments += argument;

            if (nesting < 0)
                break;
            else if (!symbols.hasNext())
                that->error("missing ')' in macro usage");
        }

        // empty VA_ARGS
        if (macro.isVariadic && arguments.size() == macro.arguments.size() - 1)
            arguments += Symbols();

        // now replace the macro arguments with the expanded arguments
        enum Mode {
            Normal,
            Hash,
            HashHash
        } mode = Normal;

        const auto end = macro.symbols.cend();
        auto it = macro.symbols.cbegin();
        const auto lastSym = std::prev(macro.symbols.cend(), !macro.symbols.isEmpty() ? 1 : 0);
        for (; it != end; ++it) {
            const Symbol &s = *it;
            if (s.token == HASH || s.token == PP_HASHHASH) {
                mode = (s.token == HASH ? Hash : HashHash);
                continue;
            }
            const qsizetype index = macro.arguments.indexOf(s);
            if (mode == Normal) {
                if (index >= 0 && index < arguments.size()) {
                    // each argument undoergoes macro expansion if it's not used as part of a # or ##
                    if (it == lastSym || std::next(it)->token != PP_HASHHASH) {
                        Symbols arg = arguments.at(index);
                        qsizetype idx = 1;
                        macroExpand(&expansion, that, arg, idx, lineNum, false, symbols.excludeSymbols());
                    } else {
                        expansion += arguments.at(index);
                    }
               } else {
                    expansion += s;
                }
            } else if (mode == Hash) {
                if (index < 0) {
                    that->error("'#' is not followed by a macro parameter");
                    continue;
                } else if (index >= arguments.size()) {
                    that->error("Macro invoked with too few parameters for a use of '#'");
                    continue;
                }

                const Symbols &arg = arguments.at(index);
                QByteArray stringified;
                for (const Symbol &sym : arg)
                    stringified += sym.lexem();

                stringified.replace('"', "\\\"");
                stringified.prepend('"');
                stringified.append('"');
                expansion += Symbol(lineNum, STRING_LITERAL, stringified);
            } else if (mode == HashHash){
                if (s.token == WHITESPACE)
                    continue;

                while (expansion.size() && expansion.constLast().token == PP_WHITESPACE)
                    expansion.pop_back();

                Symbol next = s;
                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (arg.size() == 0) {
                        mode = Normal;
                        continue;
                    }
                    next = arg.at(0);
                }

                if (!expansion.isEmpty() && expansion.constLast().token == s.token
                    && expansion.constLast().token != STRING_LITERAL) {
                    Symbol last = expansion.takeLast();

                    QByteArray lexem = last.lexem() + next.lexem();
                    expansion += Symbol(lineNum, last.token, lexem);
                } else {
                    expansion += next;
                }

                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (!arg.isEmpty())
                        expansion.append(arg.cbegin() + 1, arg.cend());
                }
            }
            mode = Normal;
        }
        if (mode != Normal)
            that->error("'#' or '##' found at the end of a macro argument");

    }

    return expansion;
}